

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

void __thiscall AmpIO::CheckCollectCallback(AmpIO *this)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  void *this_00;
  ushort local_16;
  ushort local_14;
  byte local_12;
  bool local_11;
  unsigned_short numAvail;
  unsigned_short collect_windex;
  uchar fpgaChan;
  AmpIO *pAStack_10;
  bool fpgaCollecting;
  AmpIO *this_local;
  
  if (this->collect_cb != (CollectCallback)0x0) {
    pAStack_10 = this;
    bVar1 = GetCollectionStatus(this,&local_11,&local_12,&local_14);
    if (bVar1) {
      if (((this->collect_state & 1U) == 0) || ((local_11 & 1U) != 0)) {
        if (local_12 != this->collect_chan) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"CheckCollectCallback: channel mismatch: ")
          ;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)local_12);
          poVar3 = std::operator<<(poVar3,", ");
          this_00 = (void *)std::ostream::operator<<(poVar3,(uint)this->collect_chan);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
        if (local_14 < this->collect_rindex) {
          local_16 = (local_14 + 0x400) - this->collect_rindex;
        }
        else {
          local_16 = local_14 - this->collect_rindex;
        }
        if (local_16 != 0) {
          uVar2 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
          if (uVar2 >> 2 < (uint)local_16) {
            uVar2 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
            local_16 = (ushort)(uVar2 >> 2);
          }
          bVar1 = ReadCollectedData(this,this->collect_data,this->collect_rindex,local_16);
          if (bVar1) {
            this->collect_rindex = this->collect_rindex + local_16;
            if (0x3ff < this->collect_rindex) {
              this->collect_rindex = this->collect_rindex - 0x400;
            }
          }
          else {
            local_16 = 0;
          }
        }
        bVar1 = (*this->collect_cb)(this->collect_data,local_16);
        if (!bVar1) {
          DataCollectionStop(this);
        }
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "CheckCollectCallback: failed to get collection status");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void AmpIO::CheckCollectCallback()
{
    if (collect_cb == 0) return;
    bool fpgaCollecting;
    unsigned char fpgaChan;
    unsigned short collect_windex;
    if (!GetCollectionStatus(fpgaCollecting, fpgaChan, collect_windex)) {
        std::cerr << "CheckCollectCallback: failed to get collection status" << std::endl;
        return;
    }
    // Wait to make sure FPGA is collecting data
    if (collect_state && !fpgaCollecting)
        return;
    if (fpgaChan != collect_chan) {
        std::cerr << "CheckCollectCallback: channel mismatch: "
                  << static_cast<unsigned int>(fpgaChan) << ", "
                  << static_cast<unsigned int>(collect_chan) << std::endl;
        // Continue processing
    }
    // Figure out how much data is available
    // (this implementation works correctly for unsigned integers)
    unsigned short numAvail = (collect_windex >= collect_rindex) ? (collect_windex-collect_rindex)
                                                                 : (COLLECT_BUFSIZE +collect_windex-collect_rindex);
    if (numAvail > 0) {
        if (numAvail > (port->GetMaxReadDataSize()/sizeof(quadlet_t)))
            numAvail = static_cast<unsigned short>(port->GetMaxReadDataSize()/sizeof(quadlet_t));
        if (ReadCollectedData(collect_data, collect_rindex, numAvail)) {
            collect_rindex += numAvail;
            if (collect_rindex >= COLLECT_BUFSIZE)
                collect_rindex -= COLLECT_BUFSIZE;
        }
        else
            numAvail = 0;
    }
    if (!(*collect_cb)(collect_data, numAvail))
        DataCollectionStop();
}